

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O3

void visit_class_decl(gvisitor_t *self,gnode_class_decl_t *node)

{
  gnode_class_decl_t *node_00;
  size_t sVar1;
  ulong uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  gravity_class_t *pgVar7;
  gnode_t *pgVar8;
  symboltable_t *table;
  void *pvVar9;
  gnode_t *pgVar10;
  char *format;
  char *pcVar11;
  long *plVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  gnode_t *node_01;
  ulong uVar16;
  
  pgVar8 = *(gnode_t **)((*self->data)[2] + -8 + **self->data * 8);
  check_access_storage_specifiers(self,&node->base,pgVar8->tag,node->access,node->storage);
  node->env = pgVar8;
  iVar6 = string_cmp(node->identifier,"init");
  if (iVar6 == 0) {
    format = "%s is a special name and cannot be used as class identifier.";
    pcVar11 = "init";
LAB_0011e177:
    report_error(self,GRAVITY_ERROR_SEMANTIC,&node->base,format,pcVar11);
    return;
  }
  node_00 = (gnode_class_decl_t *)node->superclass;
  if (node_00 == (gnode_class_decl_t *)0x0) goto LAB_0011e2ba;
  node->superclass = (gnode_t *)0x0;
  pgVar7 = gravity_core_class_from_name(*(char **)&node_00->bridge);
  pcVar11 = *(char **)&node_00->bridge;
  if (pgVar7 != (gravity_class_t *)0x0) {
    format = "Unable to subclass built-in core class %s.";
    node = node_00;
    goto LAB_0011e177;
  }
  pgVar8 = lookup_identifier(self,pcVar11,(gnode_identifier_expr_t *)node_00);
  if (pgVar8 == (gnode_t *)0x0) {
    pgVar10 = *(gnode_t **)&node_00->bridge;
    pcVar11 = "%s %s not found.";
LAB_0011e280:
    report_error(self,GRAVITY_ERROR_SEMANTIC,(gnode_t *)node_00,pcVar11,"Class",pgVar10);
    node->superclass = (gnode_t *)0x0;
    pcVar11 = "Unable to find superclass %s for class %s.";
LAB_0011e296:
    report_error(self,GRAVITY_ERROR_SEMANTIC,(gnode_t *)node_00,pcVar11,*(char **)&node_00->bridge,
                 node->identifier);
  }
  else {
    pgVar10 = node_00->env;
    if (pgVar10 != (gnode_t *)0x0) {
      table = symtable_from_node(pgVar8);
      if (table != (symboltable_t *)0x0) {
        pgVar8 = symboltable_lookup(table,(char *)pgVar10);
        if (pgVar8 != (gnode_t *)0x0) goto LAB_0011e1d6;
        pgVar10 = node_00->env;
      }
      pcVar11 = "%s %s not found in %s.";
      goto LAB_0011e280;
    }
LAB_0011e1d6:
    node->superclass = pgVar8;
    pgVar8 = gnode2class(pgVar8,&node->super_extern);
    if (pgVar8 == (gnode_t *)0x0) {
      pcVar11 = "Unable to set non class %s as superclass of %s.";
      goto LAB_0011e296;
    }
    if (*(gnode_class_decl_t **)&pgVar8[1].token.bytes == node) {
      report_error(self,GRAVITY_ERROR_SEMANTIC,(gnode_t *)node_00,
                   "Unable to set circular class hierarchies (%s <-> %s).",
                   *(char **)&node_00->bridge,node->identifier);
      gnode_free((gnode_t *)node_00);
      return;
    }
  }
  gnode_free((gnode_t *)node_00);
LAB_0011e2ba:
  plVar12 = *self->data;
  lVar13 = *plVar12;
  if (lVar13 == plVar12[1]) {
    lVar15 = 8;
    if (lVar13 != 0) {
      lVar15 = lVar13 * 2;
    }
    plVar12[1] = lVar15;
    pvVar9 = realloc((void *)plVar12[2],lVar15 << 3);
    plVar12 = *self->data;
    plVar12[2] = (long)pvVar9;
    lVar13 = *plVar12;
  }
  else {
    pvVar9 = (void *)plVar12[2];
  }
  *plVar12 = lVar13 + 1;
  *(gnode_class_decl_t **)((long)pvVar9 + lVar13 * 8) = node;
  if ((node->decls != (gnode_r *)0x0) && (sVar1 = node->decls->n, sVar1 != 0)) {
    uVar16 = 0;
    do {
      if (uVar16 < node->decls->n) {
        pgVar8 = node->decls->p[uVar16];
      }
      else {
        pgVar8 = (gnode_t *)0x0;
      }
      pgVar10 = node->superclass;
      if ((((pgVar10 != (gnode_t *)0x0) && (pgVar8->tag == NODE_VARIABLE_DECL)) &&
          (*(ulong **)&pgVar8[1].token != (ulong *)0x0)) &&
         ((pgVar10->tag == NODE_CLASS_DECL && (uVar2 = **(ulong **)&pgVar8[1].token, uVar2 != 0))))
      {
        uVar14 = 0;
        do {
          if (((uVar14 < **(ulong **)&pgVar8[1].token) &&
              (lVar13 = *(long *)((*(ulong **)&pgVar8[1].token)[2] + uVar14 * 8), lVar13 != 0)) &&
             (iVar6 = string_cmp(*(char **)(lVar13 + 0x50),"outer"), iVar6 != 0)) {
            if (pgVar10 == (gnode_t *)0x0) {
              pgVar10 = (gnode_t *)0x0;
            }
            else {
              while( true ) {
                node_01 = pgVar10;
                pgVar10 = symboltable_lookup((symboltable_t *)node_01[1].decl,
                                             *(char **)(lVar13 + 0x50));
                if (pgVar10 != (gnode_t *)0x0) {
                  uVar3._0_4_ = node_01[1].token.colno;
                  uVar3._4_4_ = node_01[1].token.position;
                  report_error(self,GRAVITY_WARNING,pgVar8,
                               "Property \'%s\' defined in class \'%s\' already defined in its superclass %s."
                               ,*(undefined8 *)(lVar13 + 0x50),node->identifier,uVar3);
                }
                pgVar10 = *(gnode_t **)&node_01[1].token.bytes;
                if (pgVar10 == (gnode_t *)0x0) break;
                if (pgVar10->tag != NODE_CLASS_DECL) {
                  uVar4._0_4_ = node_01[1].token.colno;
                  uVar4._4_4_ = node_01[1].token.position;
                  uVar5._0_4_ = pgVar10[1].tag;
                  uVar5._4_4_ = pgVar10[1].refcount;
                  report_error(self,GRAVITY_ERROR_SEMANTIC,node_01,
                               "Unable to find superclass %s for class %s.",uVar4,uVar5);
                  node_01[1].token.bytes = 0;
                  node_01[1].token.length = 0;
                  goto LAB_0011e483;
                }
              }
              pgVar10 = (gnode_t *)0x0;
            }
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 != uVar2);
      }
LAB_0011e483:
      gvisit(self,pgVar8);
      uVar16 = uVar16 + 1;
    } while (uVar16 != sVar1);
  }
  lVar13 = **self->data;
  if (lVar13 != 0) {
    **self->data = lVar13 + -1;
  }
  return;
}

Assistant:

static void visit_class_decl (gvisitor_t *self, gnode_class_decl_t *node) {
    DEBUG_CODEGEN("visit_class_decl %s", node->identifier);

    // extern means it will be provided at runtime by the delegate
    if (node->storage == TOK_KEY_EXTERN) return;

    // create a new pair of classes (class itself and its meta)
    gravity_class_t *c = gravity_class_new_pair(GET_VM(), node->identifier, NULL, node->nivar, node->nsvar);

    // mark the class as a struct
    c->is_struct = node->is_struct;
    
    // check if class has a declared superclass
    if (node->superclass) {
        // node->superclass should be a gnode_class_decl_t at this point
        if (NODE_ISA_CLASS(node->superclass)) {
            node->super_extern = (((gnode_class_decl_t *)node->superclass)->storage == TOK_KEY_EXTERN);
        } else {
            node->superclass = gnode2class((gnode_t*)node->superclass, &node->super_extern);
            if (!node->superclass) report_error(self, (gnode_t*)node, "Unable to set superclass to non class object.");
        }
        
        if (node->super_extern) {
            gravity_class_setsuper_extern(c, gnode_identifier((gnode_t*)node->superclass));
        } else {
            gnode_class_decl_t *super = (gnode_class_decl_t *)node->superclass;
            if (super->data) {
                // means that superclass has already been processed and its runtime representation is available
                gravity_class_setsuper(c, (gravity_class_t *)super->data);
            } else {
                // superclass has not yet processed so we need recheck the node at the end of the visit
                // add node to superfix for later processing
                codegen_t *data = (codegen_t *)self->data;
                node->data = (void *)c;
                marray_push(gnode_class_decl_t *, data->superfix, node);
            }
        }
    }

    CONTEXT_PUSH(c);

    // process inner declarations
    gnode_array_each(node->decls, {visit(val);});

    // adjust declaration stack
    CONTEXT_POP();

    // fix constructor chain
    process_constructor(self, c, (gnode_t *)node);

    // store class declaration in current context
    store_declaration(self, (gravity_object_t *)c, (node->storage == TOK_KEY_STATIC), NULL);

    // save runtime representation
    // since this class could be a superclass of another class
    // then save opaque gravity_class_t pointer to node->data
    node->data = (void *)c;
}